

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
SubcommandProgram_ExtrasErrors_Test::TestBody(SubcommandProgram_ExtrasErrors_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  AssertHelper local_240;
  Message local_238 [2];
  ExtrasError *anon_var_0_2;
  char *pcStack_220;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8 [32];
  iterator local_1c8;
  size_type local_1c0;
  AssertHelper local_1b8;
  Message local_1b0 [2];
  ExtrasError *anon_var_0_1;
  char *pcStack_198;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [32];
  string local_140 [32];
  iterator local_120;
  size_type local_118;
  AssertHelper local_110;
  Message local_108 [2];
  ExtrasError *anon_var_0;
  char *pcStack_f0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  allocator local_e0;
  allocator local_df;
  allocator local_de;
  allocator local_dd [20];
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  SubcommandProgram_ExtrasErrors_Test *this_local;
  
  gtest_msg.value._7_1_ = 1;
  local_c8 = &local_c0;
  local_10 = (undefined1  [8])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"one",&local_c9);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"two",local_dd);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"start",&local_de);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"three",&local_df);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"four",&local_e0);
  gtest_msg.value._7_1_ = 0;
  local_20 = &local_c0;
  local_18 = 5;
  __l_01._M_len = 5;
  __l_01._M_array = local_20;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_01);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_2a0 = local_2a0 + -1;
    std::__cxx11::string::~string((string *)local_2a0);
  } while (local_2a0 != &local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_df);
  std::allocator<char>::~allocator((allocator<char> *)&local_de);
  std::allocator<char>::~allocator((allocator<char> *)local_dd);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff10,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff10);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_f0 = 
      "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing.";
      goto LAB_00129c0f;
    }
  }
  else {
LAB_00129c0f:
    testing::Message::Message(local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x23c,pcStack_f0);
    testing::internal::AssertHelper::operator=(&local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(local_108);
  }
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  gtest_msg_1.value._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_180,"start",(allocator *)((long)&gtest_msg_1.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"three",(allocator *)((long)&gtest_msg_1.value + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"four",(allocator *)((long)&gtest_msg_1.value + 5));
  gtest_msg_1.value._4_1_ = 0;
  local_120 = &local_180;
  local_118 = 3;
  __l_00._M_len = 3;
  __l_00._M_array = local_120;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_00);
  local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120;
  do {
    local_318 = local_318 + -1;
    std::__cxx11::string::~string((string *)local_318);
  } while (local_318 != &local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe68,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe68);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((anon_var_0_1._7_1_ & 1) == 0) {
      pcStack_198 = 
      "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing.";
      goto LAB_0012a050;
    }
  }
  else {
LAB_0012a050:
    testing::Message::Message(local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x240,pcStack_198);
    testing::internal::AssertHelper::operator=(&local_1b8,local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(local_1b0);
  }
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  gtest_msg_2.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208,"one",(allocator *)((long)&gtest_msg_2.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"two",(allocator *)((long)&gtest_msg_2.value + 6));
  gtest_msg_2.value._5_1_ = 0;
  local_1c8 = &local_208;
  local_1c0 = 2;
  __l._M_len = 2;
  __l._M_array = local_1c8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l);
  local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8;
  do {
    local_380 = local_380 + -1;
    std::__cxx11::string::~string((string *)local_380);
  } while (local_380 != &local_208);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffde0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffde0);
  if (bVar1) {
    anon_var_0_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((anon_var_0_2._7_1_ & 1) != 0) goto LAB_0012a4bf;
    pcStack_220 = 
    "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_238);
  testing::internal::AssertHelper::AssertHelper
            (&local_240,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x244,pcStack_220);
  testing::internal::AssertHelper::operator=(&local_240,local_238);
  testing::internal::AssertHelper::~AssertHelper(&local_240);
  testing::Message::~Message(local_238);
LAB_0012a4bf:
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  return;
}

Assistant:

TEST_F(SubcommandProgram, ExtrasErrors) {

    args = {"one", "two", "start", "three", "four"};
    EXPECT_THROW(run(), CLI::ExtrasError);
    app.reset();

    args = {"start", "three", "four"};
    EXPECT_THROW(run(), CLI::ExtrasError);
    app.reset();

    args = {"one", "two"};
    EXPECT_THROW(run(), CLI::ExtrasError);
    app.reset();
}